

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O3

Merge __thiscall Sector::add(Sector *this,Data *new_data,bool bad_crc,uint8_t new_dam)

{
  vector<Data,_std::allocator<Data>_> *this_00;
  uint8_t uVar1;
  uint8_t *puVar2;
  pointer pDVar3;
  pointer __s1;
  pointer puVar4;
  pointer __s2;
  pointer puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  iterator __position;
  Data *pDVar11;
  int iVar12;
  size_t __n;
  size_t __n_00;
  Data *d;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  vector<Data,_std::allocator<Data>_> *__range2;
  Merge local_98;
  int local_94;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_60;
  
  if (this->m_bad_id_crc != false) {
    return Unchanged;
  }
  if (bad_crc) {
    bVar8 = has_good_data(this);
    local_98 = NewData;
    if (bVar8) {
      return Unchanged;
    }
  }
  else {
    local_98 = NewData;
    if (this->m_bad_data_crc == true) {
      std::vector<Data,_std::allocator<Data>_>::_M_erase_at_end
                (&this->m_data,
                 (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                 super__Vector_impl_data._M_start);
      this->m_bad_data_crc = false;
      this->dam = 0xfb;
      local_98 = Improved;
    }
  }
  if ((((this->datarate == _250K) && (this->encoding == MFM)) && ((this->header).size == 6)) &&
     ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0)) {
    puVar2 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                    &local_60,puVar2,
                    *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (int)puVar2);
    sVar7 = local_60._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
    ::~_Rb_tree(&local_60);
    if (sVar7 == 0) {
      pDVar3 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pDVar3) >> 3) * -0x55555555
          == 1) {
        puVar2 = *(uint8_t **)
                  &(pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
        ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )&local_60,puVar2,
                        *(int *)((long)&(pDVar3->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl + 8) - (int)puVar2);
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::~_Rb_tree(&local_60);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
          return Unchanged;
        }
      }
    }
    else {
      std::vector<Data,_std::allocator<Data>_>::_M_erase_at_end
                (&this->m_data,
                 (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                 super__Vector_impl_data._M_start);
      this->m_bad_data_crc = false;
      this->dam = 0xfb;
      local_98 = Improved;
    }
  }
  if (((this->datarate == _250K) && (this->encoding == MFM)) && ((this->header).size == 6)) {
    pDVar11 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_94 = 0x1800;
    if ((int)((ulong)((long)__position._M_current - (long)pDVar11) >> 3) * -0x55555555 != 0)
    goto LAB_0016b9a9;
  }
  else {
    pDVar11 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  local_94 = *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
LAB_0016b9a9:
  this_00 = &this->m_data;
  if (pDVar11 != __position._M_current) {
    __position._M_current = pDVar11;
    do {
      __s1 = ((__position._M_current)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      puVar4 = ((__position._M_current)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __n_00 = (long)puVar4 - (long)__s1;
      __s2 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      puVar5 = (new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __n = (long)puVar5 - (long)__s2;
      iVar12 = (int)__n_00;
      iVar10 = (int)__n;
      if (((local_94 <= iVar12) && (local_94 <= iVar10)) &&
         (iVar9 = bcmp(__s1,__s2,(long)local_94), iVar9 == 0)) {
        return Unchanged;
      }
      if (iVar12 < iVar10) {
        if ((puVar4 != __s1) && (iVar10 = bcmp(__s1,__s2,__n_00), iVar10 != 0)) goto LAB_0016ba63;
        if (local_94 <= iVar12) {
          return Unchanged;
        }
LAB_0016ba86:
        __position = std::vector<Data,_std::allocator<Data>_>::_M_erase(this_00,__position);
        local_98 = Improved;
      }
      else {
        if ((puVar5 == __s2) || (iVar9 = bcmp(__s2,__s1,__n), iVar9 == 0)) {
          if (iVar10 == iVar12) {
            return Unchanged;
          }
          if (iVar10 < local_94) {
            return Unchanged;
          }
          goto LAB_0016ba86;
        }
LAB_0016ba63:
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_finish);
    pDVar11 = (this_00->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (0 < (int)((ulong)((long)__position._M_current - (long)pDVar11) >> 3) * -0x55555555) {
    uVar1 = this->dam;
    if (uVar1 != new_dam) {
      if (uVar1 == 0xfb) {
        return Unchanged;
      }
      if (new_dam != 0xfb && uVar1 == 0xf8) {
        return Unchanged;
      }
    }
    if (this->m_bad_data_crc != true) {
      return Unchanged;
    }
    iVar12 = *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    iVar10 = *(int *)&(pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    if (iVar12 <= iVar10) {
      iVar10 = iVar12;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)iVar10);
    pvVar6 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_finish)->
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    for (this_01 = &((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                     super__Vector_impl_data._M_start)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>; this_01 != pvVar6;
        this_01 = this_01 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,(long)iVar10);
    }
  }
  std::vector<Data,_std::allocator<Data>_>::emplace_back<Data>(this_00,new_data);
  iVar10 = (int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                              .super__Vector_impl_data._M_start) >> 3);
  if (SBORROW4(opt.maxcopies,iVar10 * -0x55555555) != opt.maxcopies + iVar10 * 0x55555555 < 0) {
    std::vector<Data,_std::allocator<Data>_>::resize(this_00,(long)opt.maxcopies);
  }
  this->m_bad_data_crc = bad_crc;
  this->dam = new_dam;
  return local_98;
}

Assistant:

Sector::Merge Sector::add(Data&& new_data, bool bad_crc, uint8_t new_dam)
{
    Merge ret = Merge::NewData;

    // If the sector has a bad header CRC, it can't have any data
    if (has_badidcrc())
        return Merge::Unchanged;

#ifdef _DEBUG
    // If there's enough data, check the CRC
    if ((encoding == Encoding::MFM || encoding == Encoding::FM) &&
        static_cast<int>(new_data.size()) >= (size() + 2))
    {
        CRC16 crc;
        if (encoding == Encoding::MFM) crc.init(CRC16::A1A1A1);
        crc.add(new_dam);
        auto bad_data_crc = crc.add(new_data.data(), size() + 2) != 0;
        assert(bad_crc == bad_data_crc);
    }
#endif

    // If the exising sector has good data, ignore supplied data if it's bad
    if (bad_crc && has_good_data())
        return Merge::Unchanged;

    // If the existing sector is bad, new good data will replace it all
    if (!bad_crc && has_baddatacrc())
    {
        remove_data();
        ret = Merge::Improved;
    }

    // 8K sectors always have a CRC error, but may include a secondary checksum
    if (is_8k_sector())
    {
        // Attempt to identify the 8K checksum method used by the new data
        // If it's recognised, replace any existing data with it
        if (!ChecksumMethods(new_data.data(), new_data.size()).empty())
        {
            remove_data();
            ret = Merge::Improved;
        }
        // Do we already have a copy?
        else if (copies() == 1)
        {
            // Can we identify the method used by the existing copy?
            if (!ChecksumMethods(m_data[0].data(), m_data[0].size()).empty())
            {
                // Keep the existing, ignoring the new data
                return Merge::Unchanged;
            }
        }
    }

    // DD 8K sectors are considered complete at 6K, everything else at natural size
    auto complete_size = is_8k_sector() ? 0x1800 : new_data.size();

    // Compare existing data with the new data, to avoid storing redundant copies.
    for (auto it = m_data.begin(); it != m_data.end(); )
    {
        auto& data = *it;

        if (data.size() >= complete_size && new_data.size() >= complete_size)
        {
            // If the complete area of the data matches, ignore the new copy.
            if (!std::memcmp(data.data(), new_data.data(), complete_size))
                return Merge::Unchanged;
        }

        // Existing data is the same size or larger?
        if (data.size() >= new_data.size())
        {
            // Compare the prefix of each.
            if (std::equal(new_data.begin(), new_data.end(), data.begin()))
            {
                // If identical, or new is shorter than complete size, ignore it.
                if (data.size() == new_data.size() || new_data.size() < complete_size)
                    return Merge::Unchanged;

                // The new shorter copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }
        else // existing is shorter
        {
            // Compare the prefix of each.
            if (std::equal(data.begin(), data.end(), new_data.begin()))
            {
                // If the existing data is at least complete size, ignore the new data.
                if (data.size() >= complete_size)
                    return Merge::Unchanged;

                // The new longer copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }

        ++it;
    }

    // Will we now have multiple copies?
    if (copies() > 0)
    {
        // Damage can cause us to see different DAM values for a sector.
        // Favour normal over deleted, and deleted over anything else.
        if (dam != new_dam &&
            (dam == 0xfb || (dam == 0xf8 && new_dam != 0xfb)))
        {
            return Merge::Unchanged;
        }

        // Multiple good copies mean a difference in the gap data after
        // a good sector, perhaps due to a splice. We just ignore it.
        if (!has_baddatacrc())
            return Merge::Unchanged;

        // Keep multiple copies the same size, whichever is shortest
        auto new_size = std::min(new_data.size(), m_data[0].size());
        new_data.resize(new_size);

        // Resize any existing copies to match
        for (auto& d : m_data)
            d.resize(new_size);
    }

    // Insert the new data copy.
    m_data.emplace_back(std::move(new_data));
    limit_copies(opt.maxcopies);

    // Update the data CRC state and DAM
    m_bad_data_crc = bad_crc;
    dam = new_dam;

    return ret;
}